

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_buffer_method_set(jit_State *J,RecordFFData *rd)

{
  uint tr;
  TRef TVar1;
  TRef TVar2;
  uint uVar3;
  uint uVar4;
  
  TVar1 = recff_sbufx_check(J,rd,0);
  TVar1 = recff_sbufx_write(J,TVar1);
  tr = J->base[1];
  if ((tr & 0x1f000000) == 0xa000000) {
    uVar3 = lj_crecord_topcvoid(J,tr,rd->argv + 1);
    uVar4 = recff_sbufx_checkint(J,rd,2);
  }
  else {
    if ((tr & 0x1f000000) != 0x4000000) {
      return;
    }
    TVar2 = lj_ir_kint(J,0);
    (J->fold).ins.field_0.ot = 0x4009;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    uVar3 = lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130000;
    uVar4 = lj_opt_fold(J);
  }
  lj_ir_call(J,IRCALL_lj_bufx_set,(ulong)TVar1,(ulong)uVar3,(ulong)uVar4,(ulong)tr);
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_set(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trbuf = recff_sbufx_write(J, ud);
  TRef tr = J->base[1];
  if (tref_isstr(tr)) {
    TRef trp = emitir(IRT(IR_STRREF, IRT_PGC), tr, lj_ir_kint(J, 0));
    TRef len = emitir(IRTI(IR_FLOAD), tr, IRFL_STR_LEN);
    lj_ir_call(J, IRCALL_lj_bufx_set, trbuf, trp, len, tr);
#if LJ_HASFFI
  } else if (tref_iscdata(tr)) {
    TRef trp = lj_crecord_topcvoid(J, tr, &rd->argv[1]);
    TRef len = recff_sbufx_checkint(J, rd, 2);
    lj_ir_call(J, IRCALL_lj_bufx_set, trbuf, trp, len, tr);
#endif
  }  /* else: Interpreter will throw. */
}